

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O1

exr_result_t save_v3f(exr_context_t ctxt,exr_attribute_t *a)

{
  exr_result_t eVar1;
  exr_attr_v3f_t tmp;
  int32_t isz;
  exr_attr_v2i_t local_20;
  int32_t local_18;
  undefined4 local_14;
  
  local_18 = (((a->field_6).box2i)->max).x;
  local_20 = ((a->field_6).box2i)->min;
  local_14 = 0xc;
  eVar1 = (*ctxt->do_write)(ctxt,&local_14,4,&ctxt->output_file_offset);
  if (eVar1 == 0) {
    eVar1 = (*ctxt->do_write)(ctxt,&local_20,0xc,&ctxt->output_file_offset);
  }
  return eVar1;
}

Assistant:

static exr_result_t
save_v3f (exr_context_t ctxt, const exr_attribute_t* a)
{
    exr_result_t   rv;
    exr_attr_v3f_t tmp = *(a->v3f);

    rv = save_attr_sz (ctxt, sizeof (exr_attr_v3f_t));
    if (rv == EXR_ERR_SUCCESS) rv = save_attr_32 (ctxt, &tmp, 3);
    return rv;
}